

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void range_contains(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  
  r = roaring_bitmap_from_range(0x7b9dffff,0x7b9e0000,1);
  roaring_bitmap_printf_describe(r);
  putchar(10);
  _Var1 = roaring_bitmap_contains_range(r,0x7b9dffff,0x7b9e0000);
  _assert_true((ulong)_Var1,"roaring_bitmap_contains_range(bm, start, end - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x93);
  _Var1 = roaring_bitmap_contains_range(r,0x7b9dffff,0x7b9e0001);
  _assert_true((ulong)!_Var1,"roaring_bitmap_contains_range(bm, start, end)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x94);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(range_contains) {
    uint32_t end = 2073952257;
    uint32_t start = end - 2;
    roaring_bitmap_t *bm = roaring_bitmap_from_range(start, end - 1, 1);
    roaring_bitmap_printf_describe(bm);
    printf("\n");
    assert_true(roaring_bitmap_contains_range(bm, start, end - 1));
    assert_false(roaring_bitmap_contains_range(bm, start, end));
    roaring_bitmap_free(bm);
}